

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.h
# Opt level: O0

vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_> * __thiscall
filtered_directed_graph_t::get_connected_subgraphs
          (filtered_directed_graph_t *this,vertex_index_t minimal_number_of_vertices)

{
  bool bVar1;
  index_t iVar2;
  ostream *poVar3;
  filtered_union_find *this_00;
  size_type sVar4;
  ushort in_DX;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_> *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_short,_unordered_set<unsigned_short>_>_&&>::value,_pair<iterator,_bool>_>
  _Var5;
  pair<std::__detail::_Node_iterator<unsigned_short,_true,_false>,_bool> pVar6;
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  vertex_set;
  pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
  pair;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
  *__range2;
  vertex_index_t component;
  vertex_index_t index_1;
  unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
  connected_components;
  index_t v;
  index_t u;
  size_t index;
  size_t number_of_edges;
  filtered_union_find dset;
  vector<float,_std::allocator<float>_> weights;
  vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_> *subgraphs;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  _Node_iterator_base<unsigned_short,_false> in_stack_fffffffffffffc50;
  pair<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
  *in_stack_fffffffffffffc58;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  size_type in_stack_fffffffffffffc68;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffc70;
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  *in_stack_fffffffffffffdb0;
  filtered_directed_graph_t *in_stack_fffffffffffffdb8;
  filtered_directed_graph_t *in_stack_fffffffffffffdc0;
  _Node_iterator_base<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_false>
  local_1b0;
  _Node_iterator_base<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_false>
  local_1a8;
  undefined1 *local_1a0;
  _Node_iterator_base<unsigned_short,_false> local_198;
  undefined1 local_190;
  _Node_iterator_base<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_false>
  local_188;
  undefined1 local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  _Node_iterator_base<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_false>
  local_100;
  _Node_iterator_base<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_false>
  local_f8;
  undefined2 local_ec;
  ushort local_ea;
  undefined1 local_e8 [63];
  undefined1 local_a9;
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  ulong local_98;
  filtered_union_find local_90;
  undefined4 local_34;
  ushort local_12;
  
  local_12 = in_DX;
  poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[K");
  poVar3 = std::operator<<(poVar3,"computing connected subgraphs");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::flush<char,std::char_traits<char>>);
  std::operator<<(poVar3,"\r");
  this_00 = (filtered_union_find *)
            (ulong)*(ushort *)
                    &(in_RSI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start;
  local_34 = 0;
  std::allocator<float>::allocator((allocator<float> *)0x13daa6);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
             (value_type_conflict2 *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
             (allocator_type *)in_stack_fffffffffffffc58);
  std::allocator<float>::~allocator((allocator<float> *)0x13dad4);
  filtered_union_find::filtered_union_find(this_00,in_RSI);
  local_98 = directed_graph_t::edge_number((directed_graph_t *)0x13daf5);
  for (local_a0 = 0; local_a0 < local_98; local_a0 = local_a0 + 1) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &(in_RSI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish,local_a0 * 2);
    local_a4 = filtered_union_find::find
                         ((filtered_union_find *)
                          CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                          (index_t)((ulong)in_stack_fffffffffffffc58 >> 0x20));
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               &(in_RSI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish,local_a0 * 2 + 1);
    local_a8 = filtered_union_find::find
                         ((filtered_union_find *)
                          CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                          (index_t)((ulong)in_stack_fffffffffffffc58 >> 0x20));
    if (local_a4 != local_a8) {
      filtered_union_find::link(&local_90,(char *)(ulong)local_a4,(char *)(ulong)local_a8);
    }
  }
  local_a9 = 0;
  std::vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_>::vector
            ((vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_> *)
             0x13dc55);
  std::
  unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
  ::unordered_map((unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
                   *)0x13dc62);
  for (local_ea = 0;
      local_ea <
      *(ushort *)
       &(in_RSI->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start; local_ea = local_ea + 1) {
    iVar2 = filtered_union_find::find
                      ((filtered_union_find *)
                       CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                       (index_t)((ulong)in_stack_fffffffffffffc58 >> 0x20));
    local_ec = (undefined2)iVar2;
    local_f8._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
         ::find((unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                (key_type *)0x13dcc0);
    local_100._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
         ::end((unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    bVar1 = std::__detail::operator==(&local_f8,&local_100);
    if (bVar1) {
      local_158 = 0;
      uStack_150 = 0;
      local_168 = 0;
      uStack_160 = 0;
      local_178 = 0;
      uStack_170 = 0;
      local_148 = 0;
      std::
      unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
      ::unordered_set((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                       *)0x13dd40);
      std::
      make_pair<unsigned_short&,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>
                (&in_stack_fffffffffffffc58->first,
                 (unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                  *)in_stack_fffffffffffffc50._M_cur);
      _Var5 = std::
              unordered_map<unsigned_short,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>>>
              ::
              insert<std::pair<unsigned_short,std::unordered_set<unsigned_short,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<unsigned_short>>>>
                        ((unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                         in_stack_fffffffffffffc58);
      local_188._M_cur =
           (__node_type *)
           _Var5.first.
           super__Node_iterator_base<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_false>
           ._M_cur;
      in_stack_fffffffffffffc67 = _Var5.second;
      local_180 = in_stack_fffffffffffffc67;
      std::
      pair<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
      ::~pair((pair<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
               *)0x13dda1);
      std::
      unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
      ::~unordered_set((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                        *)0x13ddae);
    }
    in_stack_fffffffffffffc58 =
         (pair<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
          *)std::
            unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
            ::operator[]((unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
                          *)in_stack_fffffffffffffc50._M_cur,
                         (key_type *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    pVar6 = std::
            unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
            ::insert((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                      *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60),
                     (value_type *)in_stack_fffffffffffffc58);
    in_stack_fffffffffffffc50._M_cur =
         (__node_type *)pVar6.first.super__Node_iterator_base<unsigned_short,_false>._M_cur;
    in_stack_fffffffffffffc4f = pVar6.second;
    local_198._M_cur = in_stack_fffffffffffffc50._M_cur;
    local_190 = in_stack_fffffffffffffc4f;
  }
  local_1a0 = local_e8;
  local_1a8._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
       ::begin((unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  local_1b0._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
       ::end((unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  while (bVar1 = std::__detail::operator!=(&local_1a8,&local_1b0), bVar1) {
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_false,_false>
    ::operator*((_Node_iterator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_false,_false>
                 *)0x13dee1);
    std::
    pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
    ::pair((pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
            *)in_stack_fffffffffffffc50._M_cur,
           (pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
            *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    std::
    unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
    ::unordered_set((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                     *)in_stack_fffffffffffffc50._M_cur,
                    (unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                     *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    sVar4 = std::
            unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
            ::size((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                    *)0x13df17);
    if (local_12 <= sVar4) {
      std::
      unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
      ::unordered_set((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                       *)in_stack_fffffffffffffc50._M_cur,
                      (unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                       *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
      filtered_directed_graph_t
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      std::vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_>::push_back
                ((vector<filtered_directed_graph_t,_std::allocator<filtered_directed_graph_t>_> *)
                 in_stack_fffffffffffffc50._M_cur,
                 (value_type *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
      ~filtered_directed_graph_t((filtered_directed_graph_t *)in_stack_fffffffffffffc50._M_cur);
      std::
      unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
      ::~unordered_set((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                        *)0x13dfa2);
    }
    std::
    unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~unordered_set((unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                      *)0x13dfba);
    std::
    pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
    ::~pair((pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>
             *)0x13dfdf);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>,_false,_false>
                  *)in_stack_fffffffffffffc50._M_cur);
  }
  std::
  unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
  ::~unordered_map((unordered_map<unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>_>_>_>
                    *)0x13e082);
  local_a9 = 1;
  filtered_union_find::~filtered_union_find((filtered_union_find *)in_stack_fffffffffffffc50._M_cur)
  ;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
  return in_RDI;
}

Assistant:

std::vector<filtered_directed_graph_t> get_connected_subgraphs(vertex_index_t minimal_number_of_vertices) {
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "computing connected subgraphs" << std::flush << "\r";
#endif
		std::vector<value_t> weights(number_of_vertices, 0);
		filtered_union_find dset(weights);
		const auto number_of_edges = edge_number();

		for (size_t index = 0; index < number_of_edges; index++) {
			index_t u = dset.find(edges[2 * index]), v = dset.find(edges[2 * index + 1]);

			if (u != v) dset.link(u, v);
		}

		std::vector<filtered_directed_graph_t> subgraphs;
		{
			std::unordered_map<vertex_index_t, std::unordered_set<vertex_index_t>> connected_components;
			for (vertex_index_t index = 0; index < number_of_vertices; ++index) {
				vertex_index_t component = dset.find(index);
				if (connected_components.find(component) == connected_components.end()) {
					connected_components.insert(std::make_pair(component, std::unordered_set<vertex_index_t>()));
				}

				connected_components[component].insert(index);
			}

			for (auto pair : connected_components) {
				auto vertex_set = pair.second;
				if (vertex_set.size() < minimal_number_of_vertices) continue;
				subgraphs.push_back(filtered_directed_graph_t(this, vertex_set));
			}
		}

		return subgraphs;
	}